

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
          (QMovableArrayOps<QWidgetItemData> *this,qsizetype i,QWidgetItemData *args)

{
  QWidgetItemData **ppQVar1;
  qsizetype *pqVar2;
  undefined8 *puVar3;
  int iVar4;
  Data *pDVar5;
  long lVar6;
  QWidgetItemData *pQVar7;
  PrivateShared *pPVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter IStack_88;
  int local_60;
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
           d;
  if ((pDVar5 != (Data *)0x0) &&
     ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
        size == i) {
      qVar11 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtEnd
                         ((QArrayDataPointer<QWidgetItemData> *)this);
      if (qVar11 == 0) goto LAB_00526072;
      lVar6 = (this->super_QGenericArrayOps<QWidgetItemData>).
              super_QArrayDataPointer<QWidgetItemData>.size;
      pQVar7 = (this->super_QGenericArrayOps<QWidgetItemData>).
               super_QArrayDataPointer<QWidgetItemData>.ptr;
      pQVar7[lVar6].role = args->role;
      pPVar8 = (args->value).d.data.shared;
      uVar9 = *(undefined8 *)((long)&(args->value).d.data + 8);
      uVar10 = *(undefined8 *)&(args->value).d.field_0x18;
      puVar3 = (undefined8 *)((long)&pQVar7[lVar6].value.d.data + 0x10);
      *puVar3 = *(undefined8 *)((long)&(args->value).d.data + 0x10);
      puVar3[1] = uVar10;
      pQVar7[lVar6].value.d.data.shared = pPVar8;
      *(undefined8 *)((long)&pQVar7[lVar6].value.d.data + 8) = uVar9;
      (args->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(args->value).d.data + 0x10) = 0;
      *(undefined8 *)&(args->value).d.field_0x18 = 2;
LAB_005261e9:
      pqVar2 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                super_QArrayDataPointer<QWidgetItemData>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00526183;
    }
LAB_00526072:
    if (i == 0) {
      qVar11 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtBegin
                         ((QArrayDataPointer<QWidgetItemData> *)this);
      if (qVar11 != 0) {
        pQVar7 = (this->super_QGenericArrayOps<QWidgetItemData>).
                 super_QArrayDataPointer<QWidgetItemData>.ptr;
        pQVar7[-1].role = args->role;
        pPVar8 = (args->value).d.data.shared;
        uVar9 = *(undefined8 *)((long)&(args->value).d.data + 8);
        uVar10 = *(undefined8 *)&(args->value).d.field_0x18;
        *(undefined8 *)((long)&pQVar7[-1].value.d.data + 0x10) =
             *(undefined8 *)((long)&(args->value).d.data + 0x10);
        *(undefined8 *)&pQVar7[-1].value.d.field_0x18 = uVar10;
        pQVar7[-1].value.d.data.shared = pPVar8;
        *(undefined8 *)((long)&pQVar7[-1].value.d.data + 8) = uVar9;
        (args->value).d.data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(args->value).d.data + 8) = 0;
        *(undefined8 *)((long)&(args->value).d.data + 0x10) = 0;
        *(undefined8 *)&(args->value).d.field_0x18 = 2;
        ppQVar1 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                   super_QArrayDataPointer<QWidgetItemData>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_005261e9;
      }
    }
  }
  iVar4 = args->role;
  _local_60 = CONCAT44(0xaaaaaaaa,iVar4);
  local_58.shared = (args->value).d.data.shared;
  local_58._8_8_ = *(undefined8 *)((long)&(args->value).d.data + 8);
  local_58._16_8_ = *(undefined8 *)((long)&(args->value).d.data + 0x10);
  uStack_40 = *(undefined8 *)&(args->value).d.field_0x18;
  (args->value).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(args->value).d.data + 8) = 0;
  *(undefined8 *)((long)&(args->value).d.data + 0x10) = 0;
  *(undefined8 *)&(args->value).d.field_0x18 = 2;
  bVar12 = (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
           size != 0;
  QArrayDataPointer<QWidgetItemData>::detachAndGrow
            ((QArrayDataPointer<QWidgetItemData> *)this,(uint)(i == 0 && bVar12),1,
             (QWidgetItemData **)0x0,(QArrayDataPointer<QWidgetItemData> *)0x0);
  if (i == 0 && bVar12) {
    pQVar7 = (this->super_QGenericArrayOps<QWidgetItemData>).
             super_QArrayDataPointer<QWidgetItemData>.ptr;
    pQVar7[-1].role = iVar4;
    *(undefined8 *)((long)&pQVar7[-1].value.d.data + 0x10) = local_58._16_8_;
    *(undefined8 *)&pQVar7[-1].value.d.field_0x18 = uStack_40;
    pQVar7[-1].value.d.data.shared = local_58.shared;
    *(undefined8 *)((long)&pQVar7[-1].value.d.data + 8) = local_58._8_8_;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    uStack_40 = 2;
    ppQVar1 = &(this->super_QGenericArrayOps<QWidgetItemData>).
               super_QArrayDataPointer<QWidgetItemData>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QWidgetItemData>).
              super_QArrayDataPointer<QWidgetItemData>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_88,(QArrayDataPointer<QWidgetItemData> *)this,i,1);
    (IStack_88.displaceFrom)->role = iVar4;
    *(undefined8 *)((long)&((IStack_88.displaceFrom)->value).d.data + 0x10) = local_58._16_8_;
    *(undefined8 *)&((IStack_88.displaceFrom)->value).d.field_0x18 = uStack_40;
    ((IStack_88.displaceFrom)->value).d.data.shared = local_58.shared;
    *(undefined8 *)((long)&((IStack_88.displaceFrom)->value).d.data + 8) = local_58._8_8_;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    uStack_40 = 2;
    IStack_88.displaceFrom = IStack_88.displaceFrom + 1;
    Inserter::~Inserter(&IStack_88);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_00526183:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }